

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_> *this)

{
  double dVar1;
  int iVar2;
  Fad<Fad<double>_> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  pFVar3 = this->right_;
  dVar8 = (double)(this->left_).constant_;
  dVar1 = (pFVar3->val_).val_;
  __return_storage_ptr__->val_ = dVar8 / dVar1;
  iVar2 = (pFVar3->val_).dx_.num_elts;
  lVar7 = (long)iVar2;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar7 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = iVar2;
    pdVar5 = (double *)operator_new__(lVar7 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar4 = (pFVar3->val_).dx_.ptr_to_data;
    lVar6 = 0;
    do {
      pdVar5[lVar6] = (-pdVar4[lVar6] * dVar8) / (dVar1 * dVar1);
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}